

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O2

void gpc_sRGB(Pixel *out,Pixel *in,Background *back)

{
  int fixed_linear;
  byte bVar1;
  uint uVar2;
  int fixed_linear_00;
  
  bVar1 = isRGB(in->r);
  uVar2 = (uint)bVar1;
  out->r = (uint)bVar1;
  fixed_linear = in->g;
  if (fixed_linear == in->r) {
    out->g = (uint)bVar1;
    fixed_linear_00 = in->b;
    if (fixed_linear_00 == fixed_linear) goto LAB_0010c725;
  }
  else {
    bVar1 = isRGB(fixed_linear);
    uVar2 = (uint)bVar1;
    out->g = (uint)bVar1;
    fixed_linear_00 = in->b;
    if (fixed_linear_00 == in->r) {
      uVar2 = out->r;
      goto LAB_0010c725;
    }
    if (fixed_linear_00 == in->g) goto LAB_0010c725;
  }
  bVar1 = isRGB(fixed_linear_00);
  uVar2 = (uint)bVar1;
LAB_0010c725:
  out->b = uVar2;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_sRGB(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   out->r = isRGB(in->r);

   if (in->g == in->r)
   {
      out->g = out->r;

      if (in->b == in->r)
         out->b = out->r;

      else
         out->b = isRGB(in->b);
   }

   else
   {
      out->g = isRGB(in->g);

      if (in->b == in->r)
         out->b = out->r;

      else if (in->b == in->g)
         out->b = out->g;

      else
         out->b = isRGB(in->b);
   }

   out->a = 255;
}